

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O0

int run_with_options(Options *options)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  __pthread_internal_list **pp_Var4;
  size_type sVar5;
  pointer *ppLVar6;
  reference pLVar7;
  reference pPVar8;
  ParserData *data_6;
  iterator __end2_6;
  iterator __begin2_6;
  vector<ParserData,_std::allocator<ParserData>_> *__range2_6;
  LexData *data_5;
  iterator __end2_5;
  iterator __begin2_5;
  vector<LexData,_std::allocator<LexData>_> *__range2_5;
  ParserData *data_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<ParserData,_std::allocator<ParserData>_> *__range2_4;
  LexData *data_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<LexData,_std::allocator<LexData>_> *__range2_3;
  LexData *data_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<LexData,_std::allocator<LexData>_> *__range2_2;
  KeywordStats keyword_stats;
  LexData *data_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<LexData,_std::allocator<LexData>_> *__range2_1;
  int total_lines;
  LexData *data;
  iterator __end2;
  iterator __begin2;
  vector<LexData,_std::allocator<LexData>_> *__range2;
  int total_tokens;
  anon_class_48_3_2224f5ce local_210;
  function<void_()> local_1e0;
  reference local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Program prog;
  thread_pool pool;
  Stopwatch t;
  int ret_value;
  Options *options_local;
  
  uVar3 = std::__cxx11::string::c_str();
  printf("running command \"%s\"\n",uVar3);
  t.start.__d.__r._4_4_ = 0;
  Stopwatch::Stopwatch((Stopwatch *)&pool.m_doingWork);
  thread_pool::thread_pool
            ((thread_pool *)
             &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)options->threads);
  Program::Program((Program *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&options->parse_files);
  fn = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&options->parse_files);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&fn), bVar1) {
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    local_210.pool =
         (thread_pool *)
         &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)&local_210.fn,(string *)local_1c0);
    local_210.prog = (Program *)&__range1;
    std::function<void()>::function<run_with_options(Options_const&)::__0,void>
              ((function<void()> *)&local_1e0,&local_210);
    thread_pool::execute
              ((thread_pool *)
               &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_1e0);
    std::function<void_()>::~function(&local_1e0);
    run_with_options(Options_const&)::$_0::~__0((__0 *)&local_210);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  thread_pool::wait_all
            ((thread_pool *)
             &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((options->show_time & 1U) != 0) {
    Stopwatch::watch((Stopwatch *)&pool.m_doingWork,"parse files");
  }
  bVar1 = std::operator==(&options->command,"docs");
  if (bVar1) {
    docs::run(options,(thread_pool *)
                      &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(Program *)&__range1);
  }
  else {
    bVar1 = std::operator==(&options->command,"run");
    if (bVar1) {
      t.start.__d.__r._4_4_ =
           run::run(options,(thread_pool *)
                            &prog.parser_data.
                             super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(Program *)&__range1);
    }
  }
  if ((options->count_tokens & 1U) != 0) {
    __range2._0_4_ = 0;
    pp_Var4 = &prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    __end2 = std::vector<LexData,_std::allocator<LexData>_>::begin
                       ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    data = (LexData *)
           std::vector<LexData,_std::allocator<LexData>_>::end
                     ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                                       *)&data), bVar1) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
               operator*(&__end2);
      sVar5 = std::vector<Token,_std::allocator<Token>_>::size(&pLVar7->tokens);
      __range2._0_4_ = (uint)__range2 + (int)sVar5;
      __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
      operator++(&__end2);
    }
    printf("total tokens %d\n",(ulong)(uint)__range2);
  }
  if ((options->count_lines & 1U) != 0) {
    __range2_1._4_4_ = 0;
    pp_Var4 = &prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    __end2_1 = std::vector<LexData,_std::allocator<LexData>_>::begin
                         ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    data_1 = (LexData *)
             std::vector<LexData,_std::allocator<LexData>_>::end
                       ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                               *)&data_1), bVar1) {
      keyword_stats.keywords._M_elems[0x50] =
           (unsigned_long)
           __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
           ::operator*(&__end2_1);
      iVar2 = count_lines((LexData *)keyword_stats.keywords._M_elems[0x50]);
      __range2_1._4_4_ = iVar2 + __range2_1._4_4_;
      __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
      operator++(&__end2_1);
    }
    printf("total lines %d\n",(ulong)__range2_1._4_4_);
  }
  if ((options->keyword_stats & 1U) != 0) {
    KeywordStats::KeywordStats((KeywordStats *)&__range2_2);
    pp_Var4 = &prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    __end2_2 = std::vector<LexData,_std::allocator<LexData>_>::begin
                         ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    data_2 = (LexData *)
             std::vector<LexData,_std::allocator<LexData>_>::end
                       ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                               *)&data_2), bVar1) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
               operator*(&__end2_2);
      KeywordStats::add((KeywordStats *)&__range2_2,pLVar7);
      __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
      operator++(&__end2_2);
    }
    KeywordStats::print((KeywordStats *)&__range2_2);
  }
  if ((options->show_tokens & 1U) != 0) {
    pp_Var4 = &prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    __end2_3 = std::vector<LexData,_std::allocator<LexData>_>::begin
                         ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    data_3 = (LexData *)
             std::vector<LexData,_std::allocator<LexData>_>::end
                       ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                               *)&data_3), bVar1) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
               operator*(&__end2_3);
      show_tokens(pLVar7);
      __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
      operator++(&__end2_3);
    }
  }
  if ((options->show_ast & 1U) != 0) {
    ppLVar6 = &prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2_4 = std::vector<ParserData,_std::allocator<ParserData>_>::begin
                         ((vector<ParserData,_std::allocator<ParserData>_> *)ppLVar6);
    data_4 = (ParserData *)
             std::vector<ParserData,_std::allocator<ParserData>_>::end
                       ((vector<ParserData,_std::allocator<ParserData>_> *)ppLVar6);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>
                               *)&data_4), bVar1) {
      pPVar8 = __gnu_cxx::
               __normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>
               ::operator*(&__end2_4);
      show_ast(pPVar8);
      __gnu_cxx::
      __normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>::
      operator++(&__end2_4);
    }
  }
  if ((options->show_includes & 1U) != 0) {
    pp_Var4 = &prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    __end2_5 = std::vector<LexData,_std::allocator<LexData>_>::begin
                         ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    data_5 = (LexData *)
             std::vector<LexData,_std::allocator<LexData>_>::end
                       ((vector<LexData,_std::allocator<LexData>_> *)pp_Var4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>
                               *)&data_5), bVar1) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
               operator*(&__end2_5);
      show_includes(pLVar7);
      __gnu_cxx::__normal_iterator<LexData_*,_std::vector<LexData,_std::allocator<LexData>_>_>::
      operator++(&__end2_5);
    }
  }
  if ((options->show_functions & 1U) != 0) {
    ppLVar6 = &prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2_6 = std::vector<ParserData,_std::allocator<ParserData>_>::begin
                         ((vector<ParserData,_std::allocator<ParserData>_> *)ppLVar6);
    data_6 = (ParserData *)
             std::vector<ParserData,_std::allocator<ParserData>_>::end
                       ((vector<ParserData,_std::allocator<ParserData>_> *)ppLVar6);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>
                               *)&data_6), bVar1) {
      pPVar8 = __gnu_cxx::
               __normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>
               ::operator*(&__end2_6);
      show_functions(pPVar8,(bool)(options->show_tokens & 1));
      __gnu_cxx::
      __normal_iterator<ParserData_*,_std::vector<ParserData,_std::allocator<ParserData>_>_>::
      operator++(&__end2_6);
    }
  }
  Program::~Program((Program *)&__range1);
  thread_pool::~thread_pool
            ((thread_pool *)
             &prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return t.start.__d.__r._4_4_;
}

Assistant:

int run_with_options(const Options& options)
{
  std::printf("running command \"%s\"\n", options.command.c_str());
  int ret_value = 0;

  Stopwatch t;
  thread_pool pool(options.threads);
  Program prog;

  for (const auto& fn : options.parse_files) {
    pool.execute(
      [&pool, fn, &prog]{
        Lexer lexer;
        lexer.lex(fn);

        int i = prog.add_lex(lexer.move_data());

        pool.execute(
          [i, &prog]{
            LexData data;
            prog.get_lex(i, data);

            Parser parser(i);
            parser.parse(data);

            prog.add_parser_data(parser.move_data());
          });
      });
  }
  pool.wait_all();

  if (options.show_time)
    t.watch("parse files");

  if (options.command == "docs")
    docs::run(options, pool, prog);
  else if (options.command == "run")
    ret_value = run::run(options, pool, prog);

  if (options.count_tokens) {
    int total_tokens = 0;
    for (auto& data : prog.lex_data)
      total_tokens += data.tokens.size();

    std::printf("total tokens %d\n", total_tokens);
  }

  if (options.count_lines) {
    int total_lines = 0;
    for (auto& data : prog.lex_data)
      total_lines += count_lines(data);

    std::printf("total lines %d\n", total_lines);
  }

  if (options.keyword_stats) {
    KeywordStats keyword_stats;
    for (auto& data : prog.lex_data)
      keyword_stats.add(data);

    keyword_stats.print();
  }

  if (options.show_tokens) {
    for (auto& data : prog.lex_data)
      show_tokens(data);
  }

  if (options.show_ast) {
    for (auto& data : prog.parser_data)
      show_ast(data);
  }

  if (options.show_includes) {
    for (auto& data : prog.lex_data)
      show_includes(data);
  }

  if (options.show_functions) {
    for (const auto& data : prog.parser_data)
      show_functions(data, options.show_tokens);
  }

  return ret_value;
}